

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

InsertionResult * __thiscall
QHashPrivate::
Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
::findOrInsert<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
          *this,pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> *key)

{
  long lVar1;
  bool bVar2;
  QHashMultiReturnType<QGraphicsLayoutItem_*,_Qt::AnchorPoint> hash;
  ulong uVar3;
  Bucket BVar4;
  Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>,std::pair<QtGraphicsAnchorLayout::AnchorVertex*,int>>>
  *local_38;
  
  hash = qHashMulti<QGraphicsLayoutItem*,Qt::AnchorPoint>
                   (*(size_t *)(this + 0x18),&key->first,&key->second);
  if (*(long *)(this + 0x10) == 0) {
    uVar3 = *(ulong *)(this + 8);
LAB_005ceab6:
    Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
    ::rehash((Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
              *)this,uVar3 + 1);
    BVar4 = findBucketWithHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>(this,key,hash);
  }
  else {
    BVar4 = findBucketWithHash<std::pair<QGraphicsLayoutItem*,Qt::AnchorPoint>>(this,key,hash);
    bVar2 = true;
    if ((BVar4.span)->offsets[BVar4.index] != 0xff) goto LAB_005ceae9;
    uVar3 = *(ulong *)(this + 8);
    if (*(ulong *)(this + 0x10) >> 1 <= uVar3) goto LAB_005ceab6;
  }
  local_38 = this + 8;
  Span<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
  ::insert(BVar4.span,BVar4.index);
  *(long *)local_38 = *(long *)local_38 + 1;
  bVar2 = false;
LAB_005ceae9:
  lVar1 = *(long *)(this + 0x20);
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>_>
        *)this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar4.span - lVar1) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }